

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O0

vorbis_info_floor * floor0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  long lVar2;
  vorbis_info_floor0 *info;
  int j;
  codec_setup_info *ci;
  oggpack_buffer *opb_local;
  vorbis_info *vi_local;
  
  pvVar1 = vi->codec_setup;
  vi_local = (vorbis_info *)malloc(0x68);
  lVar2 = oggpack_read(opb,8);
  vi_local->version = (int)lVar2;
  lVar2 = oggpack_read(opb,0x10);
  vi_local->rate = lVar2;
  lVar2 = oggpack_read(opb,0x10);
  vi_local->bitrate_upper = lVar2;
  lVar2 = oggpack_read(opb,6);
  *(int *)&vi_local->bitrate_nominal = (int)lVar2;
  lVar2 = oggpack_read(opb,8);
  *(int *)((long)&vi_local->bitrate_nominal + 4) = (int)lVar2;
  lVar2 = oggpack_read(opb,4);
  *(int *)&vi_local->bitrate_lower = (int)lVar2 + 1;
  if ((((vi_local->version < 1) || (vi_local->rate < 1)) || (vi_local->bitrate_upper < 1)) ||
     ((int)vi_local->bitrate_lower < 1)) {
LAB_0013387e:
    floor0_free_info(vi_local);
    vi_local = (vorbis_info *)0x0;
  }
  else {
    for (info._4_4_ = 0; info._4_4_ < (int)vi_local->bitrate_lower; info._4_4_ = info._4_4_ + 1) {
      lVar2 = oggpack_read(opb,8);
      *(int *)((long)&vi_local->bitrate_lower + (long)info._4_4_ * 4 + 4) = (int)lVar2;
      if ((*(int *)((long)&vi_local->bitrate_lower + (long)info._4_4_ * 4 + 4) < 0) ||
         (*(int *)((long)pvVar1 + 0x24) <=
          *(int *)((long)&vi_local->bitrate_lower + (long)info._4_4_ * 4 + 4))) goto LAB_0013387e;
    }
  }
  return vi_local;
}

Assistant:

static vorbis_info_floor *floor0_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  int j;

  vorbis_info_floor0 *info=(vorbis_info_floor0 *)_ogg_malloc(sizeof(*info));
  info->order=oggpack_read(opb,8);
  info->rate=oggpack_read(opb,16);
  info->barkmap=oggpack_read(opb,16);
  info->ampbits=oggpack_read(opb,6);
  info->ampdB=oggpack_read(opb,8);
  info->numbooks=oggpack_read(opb,4)+1;
  
  if(info->order<1)goto err_out;
  if(info->rate<1)goto err_out;
  if(info->barkmap<1)goto err_out;
  if(info->numbooks<1)goto err_out;
    
  for(j=0;j<info->numbooks;j++){
    info->books[j]=oggpack_read(opb,8);
    if(info->books[j]<0 || info->books[j]>=ci->books)goto err_out;
  }
  return(info);

 err_out:
  floor0_free_info(info);
  return(NULL);
}